

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O0

void __thiscall Apt::SortTaxiEdges(Apt *this)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  iterator __first;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_RDI;
  size_t eIdx;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb8;
  anon_class_8_1_8991fb9c __comp;
  size_type in_stack_ffffffffffffffe8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffff0;
  ulong uVar3;
  ulong __n;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1a6e6f);
  __comp.this = (Apt *)(in_RDI._M_current + 0x20);
  std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>::size
            ((vector<TaxiEdge,_std::allocator<TaxiEdge>_> *)(in_RDI._M_current + 0x1d));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  uVar3 = 0;
  while (__n = uVar3,
        sVar2 = std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>::size
                          ((vector<TaxiEdge,_std::allocator<TaxiEdge>_> *)(in_RDI._M_current + 0x1d)
                          ), uVar3 < sVar2) {
    this_00 = std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>::operator[]
                        ((vector<TaxiEdge,_std::allocator<TaxiEdge>_> *)(in_RDI._M_current + 0x1d),
                         __n);
    bVar1 = TaxiEdge::isValid(this_00);
    if (bVar1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__comp.this,
                 in_RDI._M_current);
    }
    uVar3 = __n + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffffb8);
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      (in_stack_ffffffffffffffb8);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Apt::SortTaxiEdges()::_lambda(unsigned_long,unsigned_long)_1_>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,in_RDI,__comp);
  return;
}

Assistant:

void SortTaxiEdges ()
    {
        // We add all valid(!) edges to the sort array
        vecTaxiEdgesIdxHead.clear();
        vecTaxiEdgesIdxHead.reserve(vecTaxiEdges.size());
        for (size_t eIdx = 0; eIdx < vecTaxiEdges.size(); ++eIdx)
            if (vecTaxiEdges[eIdx].isValid())
                vecTaxiEdgesIdxHead.push_back(eIdx);
        
        // Now sort the index array by the angle of the linked edge
        std::sort(vecTaxiEdgesIdxHead.begin(),
                  vecTaxiEdgesIdxHead.end(),
                  [&](size_t a, size_t b)
                  { return vecTaxiEdges[a].angle < vecTaxiEdges[b].angle; });
    }